

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPack.c
# Opt level: O2

void Aig_ManPackFree(Aig_ManPack_t *p)

{
  int iVar1;
  
  printf("Patterns: ");
  printf("Total = %6d. ",(ulong)(uint)p->nPatTotal);
  printf("Skipped = %6d. ",(ulong)(uint)p->nPatSkip);
  iVar1 = Aig_ManPackCountCares(p);
  printf("Cares = %6.2f %%  ",(((double)iVar1 * 100.0) / (double)p->pAig->nObjs[2]) * 0.015625);
  putchar(10);
  Vec_WrdFree(p->vSigns);
  Vec_WrdFree(p->vPiPats);
  Vec_WrdFree(p->vPiCare);
  free(p);
  return;
}

Assistant:

void Aig_ManPackFree( Aig_ManPack_t * p )
{
//    Aig_ManPackPrintCare( p );
    printf( "Patterns: " );
    printf( "Total = %6d. ",   p->nPatTotal );
    printf( "Skipped = %6d. ", p->nPatSkip );
    printf( "Cares = %6.2f %%  ", 100.0*Aig_ManPackCountCares(p)/Aig_ManCiNum(p->pAig)/64 );
    printf( "\n" );
    Vec_WrdFree( p->vSigns );
    Vec_WrdFree( p->vPiPats );
    Vec_WrdFree( p->vPiCare );
    ABC_FREE( p );
}